

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::StringMaker<std::vector<bool,_std::allocator<bool>_>_>::convert
                   (vector<bool,_std::allocator<bool>_> *in)

{
  undefined1 uVar1;
  String *in_RDI;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator it;
  ostringstream oss;
  undefined2 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7a;
  undefined1 in_stack_fffffffffffffd7b;
  uint in_stack_fffffffffffffd7c;
  _Bit_iterator_base *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  String *this;
  string local_258 [32];
  _Bit_type *local_238;
  uint local_230;
  _Bit_type *local_228;
  uint local_220;
  _Bit_iterator_base *local_218;
  uint local_210;
  _Bit_iterator_base *local_208;
  uint local_200;
  undefined1 local_1f1;
  _Bit_type *local_1d8;
  uint local_1d0;
  _Bit_type *local_1c8;
  uint local_1c0;
  _Bit_type *local_1b8;
  uint local_1b0;
  _Bit_type *local_1a8;
  uint local_1a0;
  ostringstream local_188 [392];
  
  this = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"[");
  cVar2 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x15e456);
  local_1b8 = cVar2.super__Bit_iterator_base._M_p;
  local_1b0 = cVar2.super__Bit_iterator_base._M_offset;
  local_1a8 = local_1b8;
  local_1a0 = local_1b0;
  while( true ) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)0x15e490);
    local_1d8 = cVar2.super__Bit_iterator_base._M_p;
    local_1d0 = cVar2.super__Bit_iterator_base._M_offset;
    local_1c8 = local_1d8;
    local_1c0 = local_1d0;
    uVar1 = std::operator!=(in_stack_fffffffffffffd80,
                            (_Bit_iterator_base *)
                            CONCAT44(in_stack_fffffffffffffd7c,
                                     CONCAT13(in_stack_fffffffffffffd7b,
                                              CONCAT12(in_stack_fffffffffffffd7a,
                                                       in_stack_fffffffffffffd78))));
    if (!(bool)uVar1) break;
    cVar3 = std::_Bit_const_iterator::operator++
                      ((_Bit_const_iterator *)
                       CONCAT44(in_stack_fffffffffffffd7c,
                                CONCAT13(in_stack_fffffffffffffd7b,
                                         CONCAT12(in_stack_fffffffffffffd7a,
                                                  in_stack_fffffffffffffd78))),0);
    in_stack_fffffffffffffd80 = (_Bit_iterator_base *)cVar3.super__Bit_iterator_base._M_p;
    in_stack_fffffffffffffd7c = cVar3.super__Bit_iterator_base._M_offset;
    local_218 = in_stack_fffffffffffffd80;
    local_210 = in_stack_fffffffffffffd7c;
    local_208 = in_stack_fffffffffffffd80;
    local_200 = in_stack_fffffffffffffd7c;
    in_stack_fffffffffffffd7b =
         std::_Bit_const_iterator::operator*((_Bit_const_iterator *)in_stack_fffffffffffffd80);
    local_1f1 = in_stack_fffffffffffffd7b;
    detail::StringMakerBase<true>::convert<bool>((bool *)CONCAT17(uVar1,in_stack_fffffffffffffd88));
    doctest::operator<<((ostream *)in_stack_fffffffffffffd80,
                        (String *)
                        CONCAT44(in_stack_fffffffffffffd7c,
                                 CONCAT13(in_stack_fffffffffffffd7b,
                                          CONCAT12(in_stack_fffffffffffffd7a,
                                                   in_stack_fffffffffffffd78))));
    String::~String(this);
    cVar2 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)0x15e591);
    local_238 = cVar2.super__Bit_iterator_base._M_p;
    local_230 = cVar2.super__Bit_iterator_base._M_offset;
    local_228 = local_238;
    local_220 = local_230;
    in_stack_fffffffffffffd7a =
         std::operator!=(in_stack_fffffffffffffd80,
                         (_Bit_iterator_base *)
                         CONCAT44(in_stack_fffffffffffffd7c,
                                  CONCAT13(in_stack_fffffffffffffd7b,
                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                    in_stack_fffffffffffffd78))));
    if ((bool)in_stack_fffffffffffffd7a) {
      std::operator<<((ostream *)local_188,", ");
    }
  }
  std::operator<<((ostream *)local_188,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  String::String(this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffd88));
  std::__cxx11::string::~string(local_258);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }